

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::AtomicCounterActiveVariablesCase::iterate
          (AtomicCounterActiveVariablesCase *this)

{
  _Rb_tree_header *this_00;
  RenderContext *renderCtx;
  Shader *pSVar1;
  Program *programDefinition;
  TestLog *pTVar2;
  bool bVar3;
  __type_conflict _Var4;
  int iVar5;
  int iVar6;
  deUint32 dVar7;
  undefined4 extraout_var;
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
  *pvVar9;
  iterator iVar10;
  mapped_type_conflict *pmVar11;
  _Base_ptr p_Var12;
  undefined4 extraout_var_00;
  char *pcVar13;
  long lVar14;
  int ndx;
  long lVar15;
  int varNdx_2;
  long lVar16;
  _Rb_tree_header *p_Var17;
  int varNdx;
  bool bVar18;
  bool bVar19;
  GLint written;
  GLint numActiveVariables;
  int local_2f4;
  int local_2f0;
  GLenum activeVariablesProp;
  GLint queryActiveResources;
  undefined4 uStack_2e4;
  pointer piStack_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  ScopedLogSection section;
  GLint queryMaxNumActiveVariables;
  undefined4 uStack_2a4;
  pointer pcStack_2a0;
  pointer local_298;
  ScopedLogSection section_1;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> numBufferVars;
  ShaderProgram program;
  long lVar8;
  
  iVar5 = (*((this->super_AtomicCounterCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar5);
  renderCtx = ((this->super_AtomicCounterCase).super_TestCase.m_context)->m_renderCtx;
  generateProgramInterfaceProgramSources
            ((ProgramSources *)&numBufferVars,(this->super_AtomicCounterCase).m_program);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,(ProgramSources *)&numBufferVars);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&numBufferVars);
  local_2f0 = AtomicCounterCase::getNumAtomicCounterBuffers(&this->super_AtomicCounterCase);
  p_Var17 = &numBufferVars._M_t._M_impl.super__Rb_tree_header;
  numBufferVars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  numBufferVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  numBufferVars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar14 = 0;
  lVar15 = 0;
  numBufferVars._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var17->_M_header;
  numBufferVars._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var17->_M_header;
  while( true ) {
    pvVar9 = ProgramInterfaceDefinition::Program::getShaders
                       ((this->super_AtomicCounterCase).m_program);
    pSVar1 = *(pvVar9->
              super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((int)(((long)(pSVar1->m_defaultBlock).variables.
                     super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              *(long *)&(pSVar1->m_defaultBlock).variables.
                        super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                        ._M_impl) / 0x60) <= lVar15) break;
    pvVar9 = ProgramInterfaceDefinition::Program::getShaders
                       ((this->super_AtomicCounterCase).m_program);
    if (*(int *)(*(long *)&((*(pvVar9->
                              super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                              )._M_impl.super__Vector_impl_data._M_start)->m_defaultBlock).variables
                           .
                           super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                           ._M_impl + 0x20 + lVar14) == 0) {
      pvVar9 = ProgramInterfaceDefinition::Program::getShaders
                         ((this->super_AtomicCounterCase).m_program);
      if (*(int *)(*(long *)&((*(pvVar9->
                                super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                                )._M_impl.super__Vector_impl_data._M_start)->m_defaultBlock).
                             variables.
                             super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                             ._M_impl + 0x28 + lVar14) == 0x54) {
        pvVar9 = ProgramInterfaceDefinition::Program::getShaders
                           ((this->super_AtomicCounterCase).m_program);
        queryActiveResources =
             *(undefined4 *)
              (*(long *)&((*(pvVar9->
                            super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                            )._M_impl.super__Vector_impl_data._M_start)->m_defaultBlock).variables.
                         super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                         ._M_impl + 4 + lVar14);
        iVar10 = std::
                 _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                 ::find(&numBufferVars._M_t,&queryActiveResources);
        if ((_Rb_tree_header *)iVar10._M_node == p_Var17) {
          pmVar11 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)&numBufferVars._M_t,&queryActiveResources);
          *pmVar11 = 1;
        }
        else {
          pmVar11 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)&numBufferVars._M_t,&queryActiveResources);
          *pmVar11 = *pmVar11 + 1;
        }
      }
    }
    lVar15 = lVar15 + 1;
    lVar14 = lVar14 + 0x60;
  }
  iVar5 = 0;
  for (p_Var12 = numBufferVars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var12 != p_Var17; p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12))
  {
    if (iVar5 <= *(int *)&p_Var12[1].field_0x4) {
      iVar5 = *(int *)&p_Var12[1].field_0x4;
    }
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&numBufferVars._M_t);
  tcu::TestContext::setTestResult
            ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             QP_TEST_RESULT_PASS,"Pass");
  programDefinition = (this->super_AtomicCounterCase).m_program;
  iVar6 = (*((this->super_AtomicCounterCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  checkAndLogProgram(&program,programDefinition,(Functions *)CONCAT44(extraout_var_00,iVar6),
                     ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx)->m_log);
  pTVar2 = ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
           ->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&numBufferVars,"Interface",(allocator<char> *)&queryMaxNumActiveVariables);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&queryActiveResources,"ATOMIC_COUNTER_BUFFER interface",
             (allocator<char> *)&section_1);
  tcu::ScopedLogSection::ScopedLogSection
            (&section,pTVar2,(string *)&numBufferVars,(string *)&queryActiveResources);
  std::__cxx11::string::~string((string *)&queryActiveResources);
  std::__cxx11::string::~string((string *)&numBufferVars);
  queryActiveResources = 0xffffffff;
  _queryMaxNumActiveVariables = (pointer)CONCAT44(uStack_2a4,0xffffffff);
  (**(code **)(lVar8 + 0x990))(program.m_program.m_program,0x92c0,0x92f5,&queryActiveResources);
  (**(code **)(lVar8 + 0x990))
            (program.m_program.m_program,0x92c0,0x92f7,&queryMaxNumActiveVariables);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"query interface",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                  ,0x944);
  numBufferVars._M_t._M_impl._0_8_ =
       ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
       m_log;
  p_Var17 = &numBufferVars._M_t._M_impl.super__Rb_tree_header;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)p_Var17);
  std::operator<<((ostream *)p_Var17,"GL_ACTIVE_RESOURCES = ");
  std::ostream::operator<<(p_Var17,queryActiveResources);
  std::operator<<((ostream *)p_Var17,"\n");
  std::operator<<((ostream *)p_Var17,"GL_MAX_NUM_ACTIVE_VARIABLES = ");
  std::ostream::operator<<(p_Var17,queryMaxNumActiveVariables);
  std::operator<<((ostream *)p_Var17,"\n");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&numBufferVars,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)p_Var17);
  if (queryActiveResources != local_2f0) {
    numBufferVars._M_t._M_impl._0_8_ =
         ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
         m_log;
    p_Var17 = &numBufferVars._M_t._M_impl.super__Rb_tree_header;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)p_Var17);
    std::operator<<((ostream *)p_Var17,"Error, got unexpected GL_ACTIVE_RESOURCES, expected ");
    std::ostream::operator<<(p_Var17,local_2f0);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&numBufferVars,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)p_Var17);
    tcu::TestContext::setTestResult
              ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_FAIL,"got unexpected GL_ACTIVE_RESOURCES");
  }
  if (queryMaxNumActiveVariables != iVar5) {
    numBufferVars._M_t._M_impl._0_8_ =
         ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
         m_log;
    p_Var17 = &numBufferVars._M_t._M_impl.super__Rb_tree_header;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)p_Var17);
    std::operator<<((ostream *)p_Var17,
                    "Error, got unexpected GL_MAX_NUM_ACTIVE_VARIABLES, expected ");
    std::ostream::operator<<(p_Var17,iVar5);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&numBufferVars,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)p_Var17);
    tcu::TestContext::setTestResult
              ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_FAIL,"got unexpected GL_MAX_NUM_ACTIVE_VARIABLES");
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  local_2f4 = 0;
  do {
    p_Var17 = &numBufferVars._M_t._M_impl.super__Rb_tree_header;
    if (local_2f0 <= local_2f4) {
      glu::ShaderProgram::~ShaderProgram(&program);
      return STOP;
    }
    pTVar2 = ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
             )->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&numBufferVars,"Resource",(allocator<char> *)&queryMaxNumActiveVariables);
    de::toString<int>((string *)&section,&local_2f4);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &queryActiveResources,"Resource index ",(string *)&section);
    tcu::ScopedLogSection::ScopedLogSection
              (&section_1,pTVar2,(string *)&numBufferVars,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &queryActiveResources);
    std::__cxx11::string::~string((string *)&queryActiveResources);
    std::__cxx11::string::~string((string *)&section);
    std::__cxx11::string::~string((string *)&numBufferVars);
    _queryActiveResources = (pointer)0x0;
    piStack_2e0 = (pointer)0x0;
    local_2d8._M_allocated_capacity = 0;
    section.m_log = (TestLog *)0x0;
    _queryMaxNumActiveVariables = (pointer)CONCAT44(uStack_2a4,0x9304);
    activeVariablesProp = 0x9305;
    written = -1;
    numActiveVariables = -2;
    (**(code **)(lVar8 + 0x9c8))
              (program.m_program.m_program,0x92c0,local_2f4,1,&queryMaxNumActiveVariables,1,&written
              );
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"query num active variables",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                    ,0x968);
    if (numActiveVariables < 1) {
      numBufferVars._M_t._M_impl._0_8_ =
           ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
           ->m_log;
      p_Var17 = &numBufferVars._M_t._M_impl.super__Rb_tree_header;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)p_Var17);
      std::operator<<((ostream *)p_Var17,"Error, got unexpected NUM_ACTIVE_VARIABLES: ");
      std::ostream::operator<<(&numBufferVars._M_t._M_impl.super__Rb_tree_header,numActiveVariables)
      ;
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&numBufferVars,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream
                ((ostringstream *)&numBufferVars._M_t._M_impl.super__Rb_tree_header);
      pcVar13 = "got unexpected NUM_ACTIVE_VARIABLES";
LAB_012f4174:
      tcu::TestContext::setTestResult
                ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx,QP_TEST_RESULT_FAIL,pcVar13);
    }
    else {
      if (written < 1) {
        numBufferVars._M_t._M_impl._0_8_ =
             ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
             )->m_log;
        p_Var17 = &numBufferVars._M_t._M_impl.super__Rb_tree_header;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)p_Var17);
        std::operator<<((ostream *)p_Var17,
                        "Error, query for NUM_ACTIVE_VARIABLES returned no values");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&numBufferVars,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream
                  ((ostringstream *)&numBufferVars._M_t._M_impl.super__Rb_tree_header);
        pcVar13 = "NUM_ACTIVE_VARIABLES query failed";
        goto LAB_012f4174;
      }
      numBufferVars._M_t._M_impl._0_8_ =
           ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
           ->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)p_Var17);
      std::operator<<((ostream *)p_Var17,"GL_NUM_ACTIVE_VARIABLES = ");
      std::ostream::operator<<(p_Var17,numActiveVariables);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&numBufferVars,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)p_Var17);
      written = -1;
      numBufferVars._M_t._M_impl._0_4_ = 0xfffffffe;
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)&queryActiveResources,
                 (long)(numActiveVariables + 1),(value_type_conflict1 *)&numBufferVars);
      (**(code **)(lVar8 + 0x9c8))
                (program.m_program.m_program,0x92c0,local_2f4,1,&activeVariablesProp,
                 numActiveVariables,&written);
      dVar7 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar7,"query active variables",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                      ,0x97e);
      if (written != numActiveVariables) {
        numBufferVars._M_t._M_impl._0_8_ =
             ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
             )->m_log;
        p_Var17 = &numBufferVars._M_t._M_impl.super__Rb_tree_header;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)p_Var17);
        std::operator<<((ostream *)p_Var17,
                        "Error, unexpected number of ACTIVE_VARIABLES, NUM_ACTIVE_VARIABLES = ");
        std::ostream::operator<<(p_Var17,numActiveVariables);
        std::operator<<((ostream *)p_Var17,", query returned ");
        std::ostream::operator<<(p_Var17,written);
        std::operator<<((ostream *)p_Var17," values");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&numBufferVars,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)p_Var17);
        pcVar13 = "got unexpected ACTIVE_VARIABLES";
        goto LAB_012f4174;
      }
      if (piStack_2e0[-1] != -2) {
        numBufferVars._M_t._M_impl._0_8_ =
             ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
             )->m_log;
        p_Var17 = &numBufferVars._M_t._M_impl.super__Rb_tree_header;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)p_Var17);
        std::operator<<((ostream *)p_Var17,
                        "Error, query for ACTIVE_VARIABLES wrote over target buffer bounds");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&numBufferVars,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream
                  ((ostringstream *)&numBufferVars._M_t._M_impl.super__Rb_tree_header);
        pcVar13 = "ACTIVE_VARIABLES query failed";
        goto LAB_012f4174;
      }
      piStack_2e0 = piStack_2e0 + -1;
      numBufferVars._M_t._M_impl._0_8_ =
           ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
           ->m_log;
      p_Var17 = &numBufferVars._M_t._M_impl.super__Rb_tree_header;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)p_Var17);
      std::operator<<((ostream *)p_Var17,"Active variable indices: {");
      this_00 = &numBufferVars._M_t._M_impl.super__Rb_tree_header;
      lVar14 = 0;
      for (lVar15 = 0; lVar15 < (int)((ulong)((long)piStack_2e0 - (long)_queryActiveResources) >> 2)
          ; lVar15 = lVar15 + 1) {
        if (lVar14 != 0) {
          std::operator<<((ostream *)p_Var17,", ");
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&numBufferVars,(int *)(_queryActiveResources + lVar14));
        lVar14 = lVar14 + 4;
      }
      std::operator<<((ostream *)p_Var17,"}");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&numBufferVars,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)p_Var17);
      for (lVar14 = 0; lVar14 < (int)((ulong)((long)piStack_2e0 - (long)_queryActiveResources) >> 2)
          ; lVar14 = lVar14 + 1) {
        numActiveVariables = -1;
        written = -1;
        activeVariablesProp = 0x92f9;
        local_298 = (pointer)0x0;
        _queryMaxNumActiveVariables = (pointer)0x0;
        pcStack_2a0 = (pointer)0x0;
        (**(code **)(lVar8 + 0x9c8))
                  (program.m_program.m_program,0x92e1,
                   *(undefined4 *)(_queryActiveResources + lVar14 * 4),1,&activeVariablesProp,1,
                   &written);
        dVar7 = (**(code **)(lVar8 + 0x800))();
        glu::checkError(dVar7,"query buffer variable name length",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                        ,0x9a8);
        if (numActiveVariables == -1 || written < 1) {
          numBufferVars._M_t._M_impl._0_8_ =
               ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx)->m_log;
          p_Var17 = &numBufferVars._M_t._M_impl.super__Rb_tree_header;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)p_Var17);
          std::operator<<((ostream *)p_Var17,"Error, query for GL_NAME_LENGTH returned no values");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&numBufferVars,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream
                    ((ostringstream *)&numBufferVars._M_t._M_impl.super__Rb_tree_header);
          pcVar13 = "GL_NAME_LENGTH query failed";
LAB_012f43f0:
          tcu::TestContext::setTestResult
                    ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx,QP_TEST_RESULT_FAIL,pcVar13);
        }
        else {
          numBufferVars._M_t._M_impl._0_1_ = 0x58;
          std::vector<char,_std::allocator<char>_>::resize
                    ((vector<char,_std::allocator<char>_> *)&queryMaxNumActiveVariables,
                     (long)(numActiveVariables + 2),(value_type *)&numBufferVars);
          written = -1;
          (**(code **)(lVar8 + 0x9c0))
                    (program.m_program.m_program,0x92e1,
                     *(undefined4 *)(_queryActiveResources + lVar14 * 4),
                     (int)pcStack_2a0 - (int)_queryMaxNumActiveVariables,&written);
          dVar7 = (**(code **)(lVar8 + 0x800))();
          glu::checkError(dVar7,"query buffer variable name",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                          ,0x9b5);
          if ((long)written < 1) {
            numBufferVars._M_t._M_impl._0_8_ =
                 ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx)->m_log;
            p_Var17 = &numBufferVars._M_t._M_impl.super__Rb_tree_header;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)p_Var17);
            std::operator<<((ostream *)p_Var17,"Error, query for resource name returned no name");
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&numBufferVars,(EndMessageToken *)&tcu::TestLog::EndMessage
                      );
            std::__cxx11::ostringstream::~ostringstream
                      ((ostringstream *)&numBufferVars._M_t._M_impl.super__Rb_tree_header);
            pcVar13 = "Name query failed";
            goto LAB_012f43f0;
          }
          numBufferVars._M_t._M_impl._0_8_ =
               &numBufferVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&numBufferVars,_queryMaxNumActiveVariables,
                     _queryMaxNumActiveVariables + written);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&section,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &numBufferVars);
          std::__cxx11::string::~string((string *)&numBufferVars);
        }
        std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                  ((_Vector_base<char,_std::allocator<char>_> *)&queryMaxNumActiveVariables);
      }
      numBufferVars._M_t._M_impl._0_8_ =
           ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
           ->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
      std::operator<<((ostream *)this_00,"Active variables:\n");
      lVar14 = 0;
      for (lVar15 = 0; lVar15 < (int)((ulong)-(long)section.m_log >> 5); lVar15 = lVar15 + 1) {
        std::operator<<((ostream *)this_00,"\t");
        std::operator<<((ostream *)this_00,(string *)((long)&(section.m_log)->m_log + lVar14));
        std::operator<<((ostream *)this_00,"\n");
        lVar14 = lVar14 + 0x20;
      }
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&numBufferVars,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
      numBufferVars._M_t._M_impl._0_8_ =
           ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
           ->m_log;
      p_Var17 = &numBufferVars._M_t._M_impl.super__Rb_tree_header;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)p_Var17);
      std::operator<<((ostream *)p_Var17,"Verifying names");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&numBufferVars,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream
                ((ostringstream *)&numBufferVars._M_t._M_impl.super__Rb_tree_header);
      bVar3 = true;
      for (lVar14 = 0; lVar14 < (int)((ulong)-(long)section.m_log >> 5); lVar14 = lVar14 + 1) {
        lVar15 = 0x40;
        lVar16 = 0;
        iVar5 = -1;
        while( true ) {
          pvVar9 = ProgramInterfaceDefinition::Program::getShaders
                             ((this->super_AtomicCounterCase).m_program);
          pSVar1 = *(pvVar9->
                    super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          if ((int)(((long)(pSVar1->m_defaultBlock).variables.
                           super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    *(long *)&(pSVar1->m_defaultBlock).variables.
                              super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                              ._M_impl) / 0x60) <= lVar16) break;
          pvVar9 = ProgramInterfaceDefinition::Program::getShaders
                             ((this->super_AtomicCounterCase).m_program);
          _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(*(long *)&((*(pvVar9->
                                                  super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                m_defaultBlock).variables.
                                                super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                                                ._M_impl + lVar15),
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(section.m_log + lVar14 * 4));
          if (_Var4) {
            pvVar9 = ProgramInterfaceDefinition::Program::getShaders
                               ((this->super_AtomicCounterCase).m_program);
            iVar6 = *(int *)(*(long *)&((*(pvVar9->
                                          super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                                          )._M_impl.super__Vector_impl_data._M_start)->
                                       m_defaultBlock).variables.
                                       super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                                       ._M_impl + -0x3c + lVar15);
            bVar18 = iVar5 == iVar6;
            bVar19 = iVar5 == -1;
            if (bVar19) {
              iVar5 = iVar6;
            }
            bVar3 = (bool)(bVar3 & (bVar19 || bVar18));
          }
          lVar16 = lVar16 + 1;
          lVar15 = lVar15 + 0x60;
        }
        if (iVar5 == -1) {
          numBufferVars._M_t._M_impl._0_8_ =
               ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx)->m_log;
          p_Var17 = &numBufferVars._M_t._M_impl.super__Rb_tree_header;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)p_Var17);
          std::operator<<((ostream *)p_Var17,"Error, could not find variable with name \"");
          std::operator<<((ostream *)p_Var17,(string *)(section.m_log + lVar14 * 4));
          std::operator<<((ostream *)p_Var17,"\"");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&numBufferVars,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)p_Var17);
          pcVar13 = "Variable name invalid";
LAB_012f46f4:
          tcu::TestContext::setTestResult
                    ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx,QP_TEST_RESULT_FAIL,pcVar13);
        }
        else {
          iVar6 = AtomicCounterCase::getBufferVariableCount(&this->super_AtomicCounterCase,iVar5);
          if (iVar6 != (int)((ulong)-(long)section.m_log >> 5)) {
            numBufferVars._M_t._M_impl._0_8_ =
                 ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx)->m_log;
            p_Var17 = &numBufferVars._M_t._M_impl.super__Rb_tree_header;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)p_Var17);
            std::operator<<((ostream *)p_Var17,"Error, unexpected variable count for binding ");
            std::ostream::operator<<(p_Var17,iVar5);
            std::operator<<((ostream *)p_Var17,". Expected ");
            iVar5 = AtomicCounterCase::getBufferVariableCount(&this->super_AtomicCounterCase,iVar5);
            std::ostream::operator<<(p_Var17,iVar5);
            std::operator<<((ostream *)p_Var17,", got ");
            std::ostream::operator<<(p_Var17,(int)((ulong)-(long)section.m_log >> 5));
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&numBufferVars,(EndMessageToken *)&tcu::TestLog::EndMessage
                      );
            std::__cxx11::ostringstream::~ostringstream
                      ((ostringstream *)&numBufferVars._M_t._M_impl.super__Rb_tree_header);
            pcVar13 = "Variable names invalid";
            goto LAB_012f46f4;
          }
        }
      }
      if (!bVar3) {
        numBufferVars._M_t._M_impl._0_8_ =
             ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
             )->m_log;
        p_Var17 = &numBufferVars._M_t._M_impl.super__Rb_tree_header;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)p_Var17);
        std::operator<<((ostream *)p_Var17,"Error, all resource do not share the same buffer");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&numBufferVars,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream
                  ((ostringstream *)&numBufferVars._M_t._M_impl.super__Rb_tree_header);
        tcu::TestContext::setTestResult
                  ((this->super_AtomicCounterCase).super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx,QP_TEST_RESULT_FAIL,"Active variables invalid");
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&section);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&queryActiveResources);
    tcu::ScopedLogSection::~ScopedLogSection(&section_1);
    local_2f4 = local_2f4 + 1;
  } while( true );
}

Assistant:

AtomicCounterActiveVariablesCase::IterateResult AtomicCounterActiveVariablesCase::iterate (void)
{
	const glw::Functions&		gl								= m_context.getRenderContext().getFunctions();
	const glu::ShaderProgram	program							(m_context.getRenderContext(), generateProgramInterfaceProgramSources(m_program));
	const int					numAtomicBuffers				= getNumAtomicCounterBuffers();
	const int					expectedMaxNumActiveVariables	= getMaxNumActiveVariables();

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	checkAndLogProgram(program, m_program, m_context.getRenderContext().getFunctions(), m_testCtx.getLog());

	// check active variables
	{
		const tcu::ScopedLogSection	section						(m_testCtx.getLog(), "Interface", "ATOMIC_COUNTER_BUFFER interface");
		glw::GLint					queryActiveResources		= -1;
		glw::GLint					queryMaxNumActiveVariables	= -1;

		gl.getProgramInterfaceiv(program.getProgram(), GL_ATOMIC_COUNTER_BUFFER, GL_ACTIVE_RESOURCES, &queryActiveResources);
		gl.getProgramInterfaceiv(program.getProgram(), GL_ATOMIC_COUNTER_BUFFER, GL_MAX_NUM_ACTIVE_VARIABLES, &queryMaxNumActiveVariables);
		GLU_EXPECT_NO_ERROR(gl.getError(), "query interface");

		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "GL_ACTIVE_RESOURCES = " << queryActiveResources << "\n"
			<< "GL_MAX_NUM_ACTIVE_VARIABLES = " << queryMaxNumActiveVariables << "\n"
			<< tcu::TestLog::EndMessage;

		if (queryActiveResources != numAtomicBuffers)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Error, got unexpected GL_ACTIVE_RESOURCES, expected " << numAtomicBuffers << tcu::TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got unexpected GL_ACTIVE_RESOURCES");
		}

		if (queryMaxNumActiveVariables != expectedMaxNumActiveVariables)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Error, got unexpected GL_MAX_NUM_ACTIVE_VARIABLES, expected " << expectedMaxNumActiveVariables << tcu::TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got unexpected GL_MAX_NUM_ACTIVE_VARIABLES");
		}
	}

	// Check each buffer
	for (int bufferNdx = 0; bufferNdx < numAtomicBuffers; ++bufferNdx)
	{
		const tcu::ScopedLogSection	section				(m_testCtx.getLog(), "Resource", "Resource index " + de::toString(bufferNdx));
		std::vector<glw::GLint>		activeVariables;
		std::vector<std::string>	memberNames;

		// Find active variables
		{
			const glw::GLenum	numActiveVariablesProp	= GL_NUM_ACTIVE_VARIABLES;
			const glw::GLenum	activeVariablesProp		= GL_ACTIVE_VARIABLES;
			glw::GLint			numActiveVariables		= -2;
			glw::GLint			written					= -1;

			gl.getProgramResourceiv(program.getProgram(), GL_ATOMIC_COUNTER_BUFFER, bufferNdx, 1, &numActiveVariablesProp, 1, &written, &numActiveVariables);
			GLU_EXPECT_NO_ERROR(gl.getError(), "query num active variables");

			if (numActiveVariables <= 0)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, got unexpected NUM_ACTIVE_VARIABLES: " << numActiveVariables  << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got unexpected NUM_ACTIVE_VARIABLES");
				continue;
			}

			if (written <= 0)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, query for NUM_ACTIVE_VARIABLES returned no values" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "NUM_ACTIVE_VARIABLES query failed");
				continue;
			}

			m_testCtx.getLog() << tcu::TestLog::Message << "GL_NUM_ACTIVE_VARIABLES = " << numActiveVariables << tcu::TestLog::EndMessage;

			written = -1;
			activeVariables.resize(numActiveVariables + 1, -2);

			gl.getProgramResourceiv(program.getProgram(), GL_ATOMIC_COUNTER_BUFFER, bufferNdx, 1, &activeVariablesProp, numActiveVariables, &written, &activeVariables[0]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "query active variables");

			if (written != numActiveVariables)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, unexpected number of ACTIVE_VARIABLES, NUM_ACTIVE_VARIABLES = " << numActiveVariables << ", query returned " << written << " values" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got unexpected ACTIVE_VARIABLES");
				continue;
			}

			if (activeVariables.back() != -2)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, query for ACTIVE_VARIABLES wrote over target buffer bounds" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "ACTIVE_VARIABLES query failed");
				continue;
			}

			activeVariables.pop_back();
		}

		// log indices
		{
			tcu::MessageBuilder builder(&m_testCtx.getLog());

			builder << "Active variable indices: {";
			for (int varNdx = 0; varNdx < (int)activeVariables.size(); ++varNdx)
			{
				if (varNdx)
					builder << ", ";
				builder << activeVariables[varNdx];
			}
			builder << "}" << tcu::TestLog::EndMessage;
		}

		// collect member names
		for (int ndx = 0; ndx < (int)activeVariables.size(); ++ndx)
		{
			const glw::GLenum	nameLengthProp	= GL_NAME_LENGTH;
			glw::GLint			nameLength		= -1;
			glw::GLint			written			= -1;
			std::vector<char>	nameBuf;

			gl.getProgramResourceiv(program.getProgram(), GL_UNIFORM, activeVariables[ndx], 1, &nameLengthProp, 1, &written, &nameLength);
			GLU_EXPECT_NO_ERROR(gl.getError(), "query buffer variable name length");

			if (written <= 0 || nameLength == -1)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, query for GL_NAME_LENGTH returned no values" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "GL_NAME_LENGTH query failed");
				continue;
			}

			nameBuf.resize(nameLength + 2, 'X'); // +2 to tolerate potential off-by-ones in some implementations, name queries will check these cases better
			written = -1;

			gl.getProgramResourceName(program.getProgram(), GL_UNIFORM, activeVariables[ndx], (int)nameBuf.size(), &written, &nameBuf[0]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "query buffer variable name");

			if (written <= 0)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, query for resource name returned no name" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Name query failed");
				continue;
			}

			memberNames.push_back(std::string(&nameBuf[0], written));
		}

		// log names
		{
			tcu::MessageBuilder builder(&m_testCtx.getLog());

			builder << "Active variables:\n";
			for (int varNdx = 0; varNdx < (int)memberNames.size(); ++varNdx)
			{
				builder << "\t" << memberNames[varNdx] << "\n";
			}
			builder << tcu::TestLog::EndMessage;
		}

		// check names are all in the same buffer
		{
			bool bindingsValid = true;

			m_testCtx.getLog() << tcu::TestLog::Message << "Verifying names" << tcu::TestLog::EndMessage;

			for (int nameNdx = 0; nameNdx < (int)memberNames.size(); ++nameNdx)
			{
				int prevBinding = -1;

				for (int varNdx = 0; varNdx < (int)m_program->getShaders()[0]->getDefaultBlock().variables.size(); ++varNdx)
				{
					if (m_program->getShaders()[0]->getDefaultBlock().variables[varNdx].name == memberNames[nameNdx])
					{
						const int varBinding = m_program->getShaders()[0]->getDefaultBlock().variables[varNdx].layout.binding;

						if (prevBinding == -1 || prevBinding == varBinding)
							prevBinding = varBinding;
						else
							bindingsValid = false;
					}
				}

				if (prevBinding == -1)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Error, could not find variable with name \"" << memberNames[nameNdx] << "\"" << tcu::TestLog::EndMessage;
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Variable name invalid");
				}
				else if (getBufferVariableCount(prevBinding) != (int)memberNames.size())
				{
					m_testCtx.getLog()
						<< tcu::TestLog::Message
						<< "Error, unexpected variable count for binding " << prevBinding
						<< ". Expected " << getBufferVariableCount(prevBinding) << ", got " << (int)memberNames.size()
						<< tcu::TestLog::EndMessage;
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Variable names invalid");
				}
			}

			if (!bindingsValid)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, all resource do not share the same buffer" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Active variables invalid");
				continue;
			}
		}
	}

	return STOP;
}